

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<signed_char,signed_char>
          (Thread *this,BinopFunc<signed_char,_signed_char> *f)

{
  char cVar1;
  u8 i;
  long lVar2;
  SR result;
  Simd<signed_char,_(unsigned_char)__x10_> lhs;
  Simd<signed_char,_(unsigned_char)__x10_> rhs;
  anon_union_16_6_113bff37_for_Value_0 local_48;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  
  local_28.v128_.v = (v128)Pop(this);
  local_38.v128_.v = (v128)Pop(this);
  lVar2 = 0;
  do {
    cVar1 = (*f)(*(char *)((long)&local_38 + lVar2),*(char *)((long)&local_28 + lVar2));
    *(char *)((long)&local_48 + lVar2) = cVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  Push(this,(Value)local_48.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}